

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O3

bool tinyusdz::prim::ReconstructPrim<tinyusdz::Scope>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,Scope *scope,
               string *warn,string *err,PrimReconstructOptions *options)

{
  _Base_ptr __k;
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint uVar3;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *pTVar4;
  bool bVar5;
  int iVar6;
  const_iterator cVar7;
  mapped_type *pmVar8;
  ostream *poVar9;
  long *plVar10;
  _Base_ptr p_Var11;
  _Rb_tree_header *p_Var12;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  ostringstream ss_w;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  string *local_240;
  string *local_238;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *local_230;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *local_228;
  _Base_ptr local_220;
  long *local_218 [2];
  long local_208 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f8;
  _Any_data local_1c8;
  code *local_1b8;
  code *pcStack_1b0;
  undefined1 local_1a8 [16];
  code *local_198;
  code *pcStack_190;
  ios_base local_138 [264];
  
  local_1f8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1f8._M_impl.super__Rb_tree_header._M_header;
  local_1f8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1f8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1f8._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var11 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_220 = &(properties->_M_t)._M_impl.super__Rb_tree_header._M_header;
  local_240 = warn;
  local_238 = err;
  local_1f8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1f8._M_impl.super__Rb_tree_header._M_header._M_left;
  if (p_Var11 == local_220) {
    bVar5 = true;
  }
  else {
    local_228 = &scope->props;
    local_230 = &scope->visibility;
    do {
      p_Var12 = &local_1f8._M_impl.super__Rb_tree_header;
      __k = p_Var11 + 1;
      iVar6 = ::std::__cxx11::string::compare((char *)__k);
      if (iVar6 == 0) {
        local_1a8._0_8_ = &local_198;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"visibility","");
        cVar7 = ::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&local_1f8,(string *)local_1a8);
        if ((code **)local_1a8._0_8_ != &local_198) {
          operator_delete((void *)local_1a8._0_8_,(ulong)((long)local_198 + 1));
        }
        if ((_Rb_tree_header *)cVar7._M_node == p_Var12) {
          if (((ulong)p_Var11[0x17]._M_parent & 0xfffffffe00000000) != 0x200000000) {
            Attribute::type_name_abi_cxx11_((string *)local_1a8,(Attribute *)(p_Var11 + 2));
            local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
            local_260._M_string_length = 5;
            local_260.field_2._M_allocated_capacity._0_6_ = 0x6e656b6f74;
            if (((local_1a8._8_8_ == 5) &&
                ((char)*(int *)(local_1a8._0_8_ + 4) == 'n' && *(int *)local_1a8._0_8_ == 0x656b6f74
                )) && (uVar3 = *(uint *)((long)&p_Var11[0x17]._M_parent + 4), uVar3 < 2)) {
              if ((code **)local_1a8._0_8_ != &local_198) {
                operator_delete((void *)local_1a8._0_8_,(ulong)((long)local_198 + 1));
              }
              if (uVar3 == 0) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"[warn]",6);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"ReconstructPrim",0xf);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
                poVar9 = (ostream *)::std::ostream::operator<<((string *)local_1a8,0xb16);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"No value assigned to `",0x16);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"visibility",10);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"` token attribute. Set default token value.",0x2b);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
                pTVar4 = local_230;
                if (local_240 != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  plVar10 = (long *)::std::__cxx11::string::_M_append
                                              ((char *)local_218,
                                               (ulong)(local_238->_M_dataplus)._M_p);
                  psVar1 = (size_type *)(plVar10 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar10 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar1) {
                    local_260.field_2._M_allocated_capacity = *psVar1;
                    local_260.field_2._8_8_ = plVar10[3];
                    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
                  }
                  else {
                    local_260.field_2._M_allocated_capacity = *psVar1;
                    local_260._M_dataplus._M_p = (pointer)*plVar10;
                  }
                  local_260._M_string_length = plVar10[1];
                  *plVar10 = (long)psVar1;
                  plVar10[1] = 0;
                  *(undefined1 *)(plVar10 + 2) = 0;
                  ::std::__cxx11::string::operator=((string *)local_240,(string *)&local_260);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_260._M_dataplus._M_p != &local_260.field_2) {
                    operator_delete(local_260._M_dataplus._M_p,
                                    local_260.field_2._M_allocated_capacity + 1);
                  }
                  if (local_218[0] != local_208) {
                    operator_delete(local_218[0],local_208[0] + 1);
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                ::std::ios_base::~ios_base(local_138);
                AttrMetas::operator=(&pTVar4->_metas,(AttrMetas *)(p_Var11 + 7));
                local_1a8._0_8_ = &local_198;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1a8,"visibility","");
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&local_1f8,(string *)local_1a8);
                if ((code **)local_1a8._0_8_ != &local_198) {
                  operator_delete((void *)local_1a8._0_8_,(ulong)((long)local_198 + 1));
                }
                goto LAB_002022cc;
              }
            }
            else if ((code **)local_1a8._0_8_ != &local_198) {
              operator_delete((void *)local_1a8._0_8_,(ulong)((long)local_198 + 1));
            }
          }
          local_1a8._8_8_ = 0;
          local_1a8._0_8_ = VisibilityEnumHandler;
          pcStack_190 = ::std::
                        _Function_handler<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        ::_M_invoke;
          local_198 = ::std::
                      _Function_handler<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      ::_M_manager;
          local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"visibility","");
          bVar5 = options->strict_allowedToken_check;
          local_1b8 = (code *)0x0;
          pcStack_1b0 = (code *)0x0;
          local_1c8._M_unused._M_object = (void *)0x0;
          local_1c8._8_8_ = 0;
          if (local_198 != (code *)0x0) {
            (*local_198)(&local_1c8,(string *)local_1a8,2);
            local_1b8 = local_198;
            pcStack_1b0 = pcStack_190;
          }
          pTVar4 = local_230;
          bVar5 = ParseTimeSampledEnumProperty<tinyusdz::Visibility,tinyusdz::Visibility>
                            ((string *)&local_260,bVar5,
                             (EnumHandlerFun<tinyusdz::Visibility> *)&local_1c8,
                             (Attribute *)(p_Var11 + 2),local_230,local_240,local_238);
          if (local_1b8 != (code *)0x0) {
            (*local_1b8)(&local_1c8,&local_1c8,__destroy_functor);
          }
          paVar2 = &local_260.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_260._M_dataplus._M_p != paVar2) {
            operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
          }
          if (bVar5) {
            AttrMetas::operator=(&pTVar4->_metas,(AttrMetas *)(p_Var11 + 7));
            local_260._M_dataplus._M_p = (pointer)paVar2;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"visibility","");
            ::std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&local_1f8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_260);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_260._M_dataplus._M_p != paVar2) {
              operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if (local_198 != (code *)0x0) {
            (*local_198)((string *)local_1a8,(string *)local_1a8,3);
          }
          if (!bVar5) {
            bVar5 = false;
            goto LAB_002023da;
          }
        }
      }
      else {
        cVar7 = ::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&local_1f8,(key_type *)__k);
        if ((_Rb_tree_header *)cVar7._M_node == p_Var12) {
          pmVar8 = ::std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                   ::operator[](local_228,(key_type *)__k);
          ::std::__cxx11::string::_M_assign((string *)pmVar8);
          (pmVar8->_attrib)._varying_authored = (bool)p_Var11[3].field_0x4;
          (pmVar8->_attrib)._variability = p_Var11[3]._M_color;
          ::std::__cxx11::string::_M_assign((string *)&(pmVar8->_attrib)._type_name);
          linb::any::operator=((any *)&(pmVar8->_attrib)._var,(any *)&p_Var11[4]._M_parent);
          (pmVar8->_attrib)._var._blocked = SUB41(p_Var11[5]._M_color,0);
          ::std::
          vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ::operator=(&(pmVar8->_attrib)._var._ts._samples,
                      (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                       *)&p_Var11[5]._M_parent);
          (pmVar8->_attrib)._var._ts._dirty = SUB41(p_Var11[6]._M_color,0);
          ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    (&(pmVar8->_attrib)._paths,
                     (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &p_Var11[6]._M_parent);
          AttrMetas::operator=(&(pmVar8->_attrib)._metas,(AttrMetas *)(p_Var11 + 7));
          *(_Base_ptr *)&pmVar8->_listOpQual = p_Var11[0x17]._M_parent;
          (pmVar8->_rel).type = *(Type *)&p_Var11[0x17]._M_left;
          Path::operator=(&(pmVar8->_rel).targetPath,(Path *)&p_Var11[0x17]._M_right);
          ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    (&(pmVar8->_rel).targetPathVector,
                     (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &p_Var11[0x1e]._M_parent);
          (pmVar8->_rel).listOpQual = p_Var11[0x1f]._M_color;
          AttrMetas::operator=(&(pmVar8->_rel)._metas,(AttrMetas *)&p_Var11[0x1f]._M_parent);
          (pmVar8->_rel)._varying_authored = *(bool *)&p_Var11[0x2f]._M_left;
          ::std::__cxx11::string::_M_assign((string *)&pmVar8->_prop_value_type_name);
          pmVar8->_has_custom = *(bool *)&p_Var11[0x30]._M_right;
          ::std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&local_1f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k);
        }
        cVar7 = ::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&local_1f8,(key_type *)__k);
        if ((_Rb_tree_header *)cVar7._M_node == &local_1f8._M_impl.super__Rb_tree_header) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[warn]",6);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                     ,0x5a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"ReconstructPrim",0xf);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<((string *)local_1a8,0xb18);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          ::std::operator+(&local_260,"Unsupported/unimplemented property: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k)
          ;
          poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,local_260._M_dataplus._M_p,
                              local_260._M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
          paVar2 = &local_260.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_260._M_dataplus._M_p != paVar2) {
            operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
          }
          if (local_240 != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            plVar10 = (long *)::std::__cxx11::string::_M_append
                                        ((char *)local_218,(ulong)(local_238->_M_dataplus)._M_p);
            psVar1 = (size_type *)(plVar10 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar1) {
              local_260.field_2._M_allocated_capacity = *psVar1;
              local_260.field_2._8_8_ = plVar10[3];
              local_260._M_dataplus._M_p = (pointer)paVar2;
            }
            else {
              local_260.field_2._M_allocated_capacity = *psVar1;
              local_260._M_dataplus._M_p = (pointer)*plVar10;
            }
            local_260._M_string_length = plVar10[1];
            *plVar10 = (long)psVar1;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            ::std::__cxx11::string::operator=((string *)local_240,(string *)&local_260);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_260._M_dataplus._M_p != paVar2) {
              operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_218[0] != local_208) {
              operator_delete(local_218[0],local_208[0] + 1);
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          ::std::ios_base::~ios_base(local_138);
        }
      }
LAB_002022cc:
      p_Var11 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var11);
    } while (p_Var11 != local_220);
    bVar5 = true;
  }
LAB_002023da:
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&local_1f8,(_Link_type)local_1f8._M_impl.super__Rb_tree_header._M_header._M_parent);
  return bVar5;
}

Assistant:

bool ReconstructPrim<Scope>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    Scope *scope,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {
  // `Scope` is just a namespace in scene graph(no node xform)

  (void)spec;
  (void)references;
  (void)scope;
  (void)err;
  (void)options;

  DCOUT("Scope");
  std::set<std::string> table;
  for (const auto &prop : properties) {
    PARSE_TIMESAMPLED_ENUM_PROPERTY(table, prop, kVisibility, Visibility, VisibilityEnumHandler, Scope,
                   scope->visibility, options.strict_allowedToken_check)
    ADD_PROPERTY(table, prop, Scope, scope->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }

  return true;
}